

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

float memory_tree_ns::get_overlap_from_two_examples(example *ec1,example *ec2)

{
  uint32_t uVar1;
  
  uVar1 = over_lap((v_array<unsigned_int> *)&(ec1->l).simple,
                   (v_array<unsigned_int> *)&(ec2->l).simple);
  return (float)uVar1;
}

Assistant:

float get_overlap_from_two_examples(example& ec1, example& ec2){
        return (float)over_lap(ec1.l.multilabels.label_v, ec2.l.multilabels.label_v);
    }